

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_spawns.cxx
# Opt level: O3

void __thiscall level_tools::reconstruct_spawns(level_tools *this)

{
  uint16_t uVar1;
  xr_level_spawn *pxVar2;
  pointer ppcVar3;
  cse_abstract *pcVar4;
  xr_level_game *pxVar5;
  pointer ppmVar6;
  mp_rpoint *pmVar7;
  char *pcVar8;
  xr_level_env_mod *pxVar9;
  pointer ppeVar10;
  env_mod_data *peVar11;
  char *pcVar12;
  int iVar13;
  xr_custom_object_vec *this_00;
  xr_spawn_object *pxVar14;
  undefined4 extraout_var;
  xr_shape_object *this_01;
  undefined4 extraout_var_00;
  shape_def_vec *__x;
  xr_level *pxVar15;
  uint16_t uVar16;
  pointer ppmVar17;
  pointer ppcVar18;
  pointer ppeVar19;
  xr_name_gen name;
  xr_name_gen local_50;
  xr_spawn_object *local_40;
  xr_scene_spawns *local_38;
  
  local_38 = xray_re::xr_scene::spawns(this->m_scene);
  this_00 = &(local_38->super_xr_scene_objects).m_objects;
  pxVar15 = this->m_level;
  if (pxVar15->m_spawn != (xr_level_spawn *)0x0) {
    xray_re::msg("building %s (%s)","spawn.part","entities");
    pxVar2 = this->m_level->m_spawn;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,(long)(pxVar2->m_spawns).
                             super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar2->m_spawns).
                             super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppcVar3 = (pxVar2->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar18 = (pxVar2->m_spawns).
                    super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar3;
        ppcVar18 = ppcVar18 + 1) {
      pcVar4 = *ppcVar18;
      if (pcVar4 == (cse_abstract *)0x0) {
        __assert_fail("entity",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_spawns.cxx"
                      ,0x1b,"void level_tools::reconstruct_spawns()");
      }
      *ppcVar18 = (cse_abstract *)0x0;
      pxVar14 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar14,this->m_scene,(char *)0x0);
      std::__cxx11::string::_M_assign((string *)&(pxVar14->super_xr_custom_object).m_name);
      (pxVar14->super_xr_custom_object).m_position.field_0.field_0.z =
           (pcVar4->m_o_position).field_0.field_0.z;
      *(undefined8 *)&(pxVar14->super_xr_custom_object).m_position.field_0 =
           *(undefined8 *)&(pcVar4->m_o_position).field_0;
      (pxVar14->super_xr_custom_object).m_rotation.field_0.field_0.z =
           (pcVar4->m_o_angle).field_0.field_0.z;
      *(undefined8 *)&(pxVar14->super_xr_custom_object).m_rotation.field_0 =
           *(undefined8 *)&(pcVar4->m_o_angle).field_0;
      uVar1 = this->m_spawn_version;
      if (uVar1 == 0x76) {
        uVar16 = 6;
LAB_00137389:
        pcVar4->m_version = uVar1;
        pcVar4->m_script_version = uVar16;
      }
      else {
        if (uVar1 == 0x7c) {
          uVar16 = 8;
          goto LAB_00137389;
        }
        if (uVar1 == 0x80) {
          uVar16 = 0xc;
          goto LAB_00137389;
        }
      }
      (pxVar14->field_1).m_entity = pcVar4;
      iVar13 = (*pcVar4->_vptr_cse_abstract[7])(pcVar4);
      if (CONCAT44(extraout_var,iVar13) != 0) {
        this_01 = (xr_shape_object *)operator_new(0x88);
        xray_re::xr_shape_object::xr_shape_object(this_01,this->m_scene);
        std::__cxx11::string::_M_replace
                  ((ulong)&(this_01->super_xr_custom_object).m_name,0,
                   (char *)(this_01->super_xr_custom_object).m_name._M_string_length,0x1ea24d);
        (this_01->super_xr_custom_object).m_position.field_0.field_0.z =
             (pcVar4->m_o_position).field_0.field_0.z;
        *(undefined8 *)&(this_01->super_xr_custom_object).m_position.field_0 =
             *(undefined8 *)&(pcVar4->m_o_position).field_0;
        *(undefined8 *)&(this_01->super_xr_custom_object).m_rotation.field_0 =
             *(undefined8 *)&(pcVar4->m_o_angle).field_0;
        (this_01->super_xr_custom_object).m_rotation.field_0.field_0.z =
             (pcVar4->m_o_angle).field_0.field_0.z;
        iVar13 = (*pcVar4->_vptr_cse_abstract[7])(pcVar4);
        __x = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_00,iVar13));
        std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::operator=
                  (&this_01->m_shapes,__x);
        pxVar14->m_attached_object = (xr_custom_object *)this_01;
      }
      local_50.m_name = (char *)pxVar14;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_50);
    }
    xray_re::xr_level::clear_spawn(this->m_level);
    pxVar15 = this->m_level;
  }
  pxVar5 = pxVar15->m_game;
  if ((pxVar5 != (xr_level_game *)0x0) &&
     ((pxVar5->m_rpoints).
      super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pxVar5->m_rpoints).
      super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    xray_re::msg("building %s (%s)","spawn.part","$rpoints");
    pxVar5 = this->m_level->m_game;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,((long)(pxVar5->m_rpoints).
                              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar5->m_rpoints).
                              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       ((long)(local_38->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_38->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
    xray_re::xr_name_gen::init(&local_50,(EVP_PKEY_CTX *)"$rpoint");
    ppmVar6 = (pxVar5->m_rpoints).
              super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppmVar17 = (pxVar5->m_rpoints).
                    super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppmVar17 != ppmVar6;
        ppmVar17 = ppmVar17 + 1) {
      pmVar7 = *ppmVar17;
      pxVar14 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar14,this->m_scene,"$rpoint");
      pcVar12 = local_50.m_name;
      pcVar8 = (char *)(pxVar14->super_xr_custom_object).m_name._M_string_length;
      strlen(local_50.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(pxVar14->super_xr_custom_object).m_name,0,pcVar8,(ulong)pcVar12);
      (pxVar14->super_xr_custom_object).m_position.field_0.field_0.x = (pmVar7->p).field_0.field_0.x
      ;
      (pxVar14->super_xr_custom_object).m_position.field_0.field_0.y = (pmVar7->p).field_0.field_0.y
      ;
      (pxVar14->super_xr_custom_object).m_position.field_0.field_0.z = (pmVar7->p).field_0.field_0.z
      ;
      (pxVar14->super_xr_custom_object).m_rotation.field_0.field_0.x = (pmVar7->a).field_0.field_0.x
      ;
      (pxVar14->super_xr_custom_object).m_rotation.field_0.field_0.y = (pmVar7->a).field_0.field_0.y
      ;
      (pxVar14->super_xr_custom_object).m_rotation.field_0.field_0.z = (pmVar7->a).field_0.field_0.z
      ;
      (pxVar14->field_1).field_0.m_team = pmVar7->team;
      (pxVar14->field_1).field_0.m_respawn = pmVar7->respawn;
      (pxVar14->field_1).field_0.m_game = pmVar7->game;
      local_40 = pxVar14;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_40);
      xray_re::xr_name_gen::next(&local_50);
    }
    operator_delete(local_50.m_name,1);
    pxVar15 = this->m_level;
  }
  pxVar9 = pxVar15->m_env_mod;
  if ((pxVar9 != (xr_level_env_mod *)0x0) &&
     ((pxVar9->m_env_mods).
      super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pxVar9->m_env_mods).
      super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    xray_re::msg("building %s (%s)","spawn.part","$env_mods");
    pxVar9 = this->m_level->m_env_mod;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,((long)(pxVar9->m_env_mods).
                              super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar9->m_env_mods).
                              super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       ((long)(local_38->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_38->super_xr_scene_objects).m_objects.
                              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3));
    xray_re::xr_name_gen::init(&local_50,(EVP_PKEY_CTX *)"$env_mod");
    ppeVar10 = (pxVar9->m_env_mods).
               super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppeVar19 = (pxVar9->m_env_mods).
                    super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppeVar19 != ppeVar10;
        ppeVar19 = ppeVar19 + 1) {
      peVar11 = *ppeVar19;
      pxVar14 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar14,this->m_scene,"$env_mod");
      pcVar12 = local_50.m_name;
      pcVar8 = (char *)(pxVar14->super_xr_custom_object).m_name._M_string_length;
      strlen(local_50.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(pxVar14->super_xr_custom_object).m_name,0,pcVar8,(ulong)pcVar12);
      (pxVar14->super_xr_custom_object).m_position.field_0.field_0.z =
           (peVar11->position).field_0.field_0.z;
      *(undefined8 *)&(pxVar14->super_xr_custom_object).m_position.field_0 =
           *(undefined8 *)&(peVar11->position).field_0;
      (pxVar14->field_1).field_1.m_radius = peVar11->radius;
      (pxVar14->field_1).field_1.m_power = peVar11->power;
      (pxVar14->field_1).field_1.m_view_distance = peVar11->far_plane;
      (pxVar14->field_1).field_1.m_fog_color =
           (uint)(long)((peVar11->fog_color).field_0.field_0.z * 255.0) |
           (int)(long)((peVar11->fog_color).field_0.field_0.y * 255.0) << 8 |
           (int)(long)((peVar11->fog_color).field_0.field_0.x * 255.0) << 0x10;
      (pxVar14->field_1).field_1.m_fog_density = peVar11->fog_density;
      (pxVar14->field_1).field_1.m_ambient_color =
           (uint)(long)((peVar11->ambient_color).field_0.field_0.z * 255.0) |
           (int)(long)((peVar11->ambient_color).field_0.field_0.y * 255.0) << 8 |
           (int)(long)((peVar11->ambient_color).field_0.field_0.x * 255.0) << 0x10;
      (pxVar14->field_1).field_1.m_sky_color =
           (uint)(long)((peVar11->sky_color).field_0.field_0.z * 255.0) |
           (int)(long)((peVar11->sky_color).field_0.field_0.y * 255.0) << 8 |
           (int)(long)((peVar11->sky_color).field_0.field_0.x * 255.0) << 0x10;
      (pxVar14->field_1).field_1.m_hemi_color =
           (uint)(long)((peVar11->hemi_color).field_0.field_0.z * 255.0) |
           (int)(long)((peVar11->hemi_color).field_0.field_0.y * 255.0) << 8 |
           (int)(long)((peVar11->hemi_color).field_0.field_0.x * 255.0) << 0x10;
      local_40 = pxVar14;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_40);
      xray_re::xr_name_gen::next(&local_50);
    }
    xray_re::xr_level::clear_env_mod(this->m_level);
    operator_delete(local_50.m_name,1);
  }
  return;
}

Assistant:

void level_tools::reconstruct_spawns()
{
	xr_custom_object_vec& cobjects = m_scene->spawns()->objects();
	if (m_level->spawn()) {
		msg("building %s (%s)", "spawn.part", "entities");

		xr_entity_vec& spawns = m_level->spawn()->spawns();
		cobjects.reserve(spawns.size());

		for (xr_entity_vec_it it = spawns.begin(), end = spawns.end(); it != end; ++it) {
			cse_abstract* entity = *it;
			xr_assert(entity);
			// borrow it as usual with spawns
			*it = 0;
			xr_spawn_object* new_spawn = new xr_spawn_object(*m_scene, 0);
			new_spawn->co_name() = entity->name_replace();
			new_spawn->co_position()= entity->position();
			new_spawn->co_rotation() = entity->rotation();
			if (m_spawn_version == CSE_VERSION_SOC)
			{
			entity->version() = CSE_VERSION_SOC;
			entity->script_version() = 6;
			}
			else if (m_spawn_version == CSE_VERSION_CS)
			{
				entity->version() = CSE_VERSION_CS;
				entity->script_version() = 8;
			}
			else if (m_spawn_version == CSE_VERSION_COP)
			{
				entity->version() = CSE_VERSION_COP;
				entity->script_version() = 12;
			}

			new_spawn->entity() = entity;
			if (entity->shape()) {
				xr_shape_object* new_shape = new xr_shape_object(*m_scene);
				new_shape->co_name() = "shape";
				new_shape->co_position()= entity->position();
				new_shape->co_rotation() = entity->rotation();
				new_shape->shapes() = entity->shape()->shapes();
				new_spawn->attached_object() = new_shape;
			}
			cobjects.push_back(new_spawn);
		}
		m_level->clear_spawn();
	}
	if (m_level->game() && !m_level->game()->rpoints().empty()) {
		msg("building %s (%s)", "spawn.part", "$rpoints");

		const mp_rpoint_vec& rpoints = m_level->game()->rpoints();
		cobjects.reserve(cobjects.size() + rpoints.size());

		xr_name_gen name("$rpoint");
		for (mp_rpoint_vec_cit it = rpoints.begin(), end = rpoints.end(); it != end; ++it, name.next()) {
			const mp_rpoint* rpoint = *it;
			xr_spawn_object* new_rpoint = new xr_spawn_object(*m_scene, "$rpoint");
			new_rpoint->co_name() = name.get();
			new_rpoint->co_position().set(rpoint->p);
			new_rpoint->co_rotation().set(rpoint->a);
			new_rpoint->team() = rpoint->team;
			new_rpoint->respawn() = rpoint->respawn;
			new_rpoint->game() = rpoint->game;
			cobjects.push_back(new_rpoint);
		}
	}
	if (m_level->env_mod() && !m_level->env_mod()->env_mods().empty()) {
		msg("building %s (%s)", "spawn.part", "$env_mods");

		const env_mod_data_vec& env_mods = m_level->env_mod()->env_mods();
		cobjects.reserve(cobjects.size() + env_mods.size());

		xr_name_gen name("$env_mod");
		for (env_mod_data_vec_cit it = env_mods.begin(), end = env_mods.end();
				it != end; ++it, name.next()) {
			const env_mod_data* env_mod = *it;
			xr_spawn_object* new_env_mod = new xr_spawn_object(*m_scene, "$env_mod");
			new_env_mod->co_name() = name.get();
			new_env_mod->co_position() = env_mod->position;
			new_env_mod->radius() = env_mod->radius;
			new_env_mod->power() = env_mod->power;
			new_env_mod->view_distance() = env_mod->far_plane;
			new_env_mod->fog_color() = to_rgba32(env_mod->fog_color);
			new_env_mod->fog_density() = env_mod->fog_density;
			new_env_mod->ambient_color() = to_rgba32(env_mod->ambient_color);
			new_env_mod->sky_color() = to_rgba32(env_mod->sky_color);
			new_env_mod->hemi_color() = to_rgba32(env_mod->hemi_color);
			cobjects.push_back(new_env_mod);
		}
		m_level->clear_env_mod();
	}
}